

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internals.h
# Opt level: O0

int bank_number(int mode)

{
  int local_c;
  int mode_local;
  
  if (mode - 0x10U < 0xf || mode == 0x1f) {
    switch((long)&switchD_0072dcde::switchdataD_01376af0 +
           (long)(int)(&switchD_0072dcde::switchdataD_01376af0)[mode - 0x10U]) {
    case 0x72dce0:
      local_c = 0;
      break;
    case 0x72dce9:
      local_c = 1;
      break;
    case 0x72dcf2:
      local_c = 2;
      break;
    case 0x72dcfb:
      local_c = 3;
      break;
    case 0x72dd04:
      local_c = 4;
      break;
    case 0x72dd0d:
      local_c = 5;
      break;
    case 0x72dd16:
      local_c = 6;
      break;
    case 0x72dd1f:
      local_c = 7;
      break;
    default:
      goto LAB_0072dd2a;
    }
    return local_c;
  }
LAB_0072dd2a:
  g_assertion_message_expr
            ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/internals.h"
             ,0x99,(char *)0x0);
}

Assistant:

static inline int bank_number(int mode)
{
    switch (mode) {
    case ARM_CPU_MODE_USR:
    case ARM_CPU_MODE_SYS:
        return BANK_USRSYS;
    case ARM_CPU_MODE_SVC:
        return BANK_SVC;
    case ARM_CPU_MODE_ABT:
        return BANK_ABT;
    case ARM_CPU_MODE_UND:
        return BANK_UND;
    case ARM_CPU_MODE_IRQ:
        return BANK_IRQ;
    case ARM_CPU_MODE_FIQ:
        return BANK_FIQ;
    case ARM_CPU_MODE_HYP:
        return BANK_HYP;
    case ARM_CPU_MODE_MON:
        return BANK_MON;
    }
    g_assert_not_reached();
    // never reach
    return BANK_MON;
}